

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

int pstore::file::file_handle::lock_reg
              (int fd,int cmd,short type,off_t offset,short whence,off_t len)

{
  int iVar1;
  undefined8 local_28;
  off_t oStack_20;
  off_t local_18;
  undefined8 uStack_10;
  
  uStack_10 = 0;
  local_28 = (ulong)CONCAT22(whence,type);
  oStack_20 = offset;
  local_18 = len;
  iVar1 = fcntl(fd,cmd,&local_28);
  return iVar1;
}

Assistant:

int file_handle::lock_reg (int const fd, int const cmd, short const type,
                                   off_t const offset, short const whence, off_t const len) {
            struct flock lock {};
            lock.l_type = type;     // type of lock: F_RDLCK, F_WRLCK, F_UNLCK
            lock.l_whence = whence; // how to interpret l_start (SEEK_SET/SEEK_CUR/SEEK_END)
            lock.l_start = offset;  // starting offset for lock
            lock.l_len = len;       // number of bytes to lock
            lock.l_pid = 0;         // PID of blocking process (set by F_GETLK and F_OFD_GETLK)
            return fcntl (fd, cmd, &lock); // NOLINT
        }